

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O1

void __thiscall PacketProcessor::feed(PacketProcessor *this,void *d,size_t size)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer *ppuVar1;
  uint uVar2;
  pointer puVar3;
  iterator __position;
  int iVar4;
  pthread_mutex_t *__mutex;
  ulong uVar5;
  long lVar6;
  pointer puVar7;
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  if (size == 0) {
    return;
  }
  this_00 = &this->buffer_;
  puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar7 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar3 == puVar7) {
LAB_00103bfd:
    lVar6 = 0;
    do {
      if (*(char *)((long)d + lVar6) == 'Z') {
        if (size <= lVar6 + 1U) {
          __position._M_current =
               (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,__position,
                       (uchar *)(lVar6 + (long)d));
          }
          else {
            *__position._M_current = 'Z';
            ppuVar1 = &(this->buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          iVar4 = 1;
          goto LAB_00103c5c;
        }
        if (*(char *)((long)d + lVar6 + 1) == -0x5b) {
          iVar4 = 6;
          goto LAB_00103c5e;
        }
      }
      lVar6 = lVar6 + 1;
    } while (size + (size == 0) != lVar6);
    iVar4 = 3;
LAB_00103c5c:
    lVar6 = 0;
LAB_00103c5e:
    if (iVar4 == 3) goto LAB_00103d5c;
    if (iVar4 != 6) {
      return;
    }
  }
  else {
    if ((long)puVar7 - (long)puVar3 == 1) {
      if (*puVar3 != 'Z') goto LAB_00103d7a;
      if (*d != -0x5b) {
        (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
        if ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != puVar3) {
          std::__shrink_to_fit_aux<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
          ::_S_do_it(this_00);
        }
        goto LAB_00103bfd;
      }
    }
    lVar6 = 0;
  }
  puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  puVar7 = puVar3 + ((size - lVar6) -
                    (long)(this->buffer_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  uVar2 = this->maxBufferSize_;
  if ((pointer)(ulong)uVar2 < puVar7) {
    __mutex = (pthread_mutex_t *)L_O_G_NS_MUTEX::mutex();
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
LAB_00103d7a:
      __assert_fail("buffer_[0] == H_1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/shuai132[P]PacketProcessor/PacketProcessor.cpp"
                    ,0x7b,"void PacketProcessor::feed(const void *, size_t)");
    }
    L_O_G_NS_GET_TIME::get_time_abi_cxx11_();
    uVar5 = syscall(0xba);
    printf("\x1b[35m%s %u [W]: %s:%d [%s] size too big, need: %zu, max: %zu\x1b[m\n",local_50,
           uVar5 & 0xffffffff,"PacketProcessor.cpp",0x87,"feed",puVar7,(ulong)this->maxBufferSize_);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    pthread_mutex_unlock(__mutex);
    puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->findHeader_ = false;
    this->dataSize_ = 0;
    (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
  }
  else {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,puVar3,(long)d + lVar6
               ,(long)d + (size - lVar6));
  }
  if ((pointer)(ulong)uVar2 < puVar7) {
    return;
  }
LAB_00103d5c:
  tryUnpack(this);
  return;
}

Assistant:

void PacketProcessor::feed(const void* d, size_t size) {
  const uint8_t* data = (uint8_t*)d;
  if (size == 0) return;
  PacketProcessor_LOGV("feed: %u", size);

  // 缓存数据(当遇到包头后才开始缓存)
  size_t startPos = 0;
  if (buffer_.empty()) {
  START_HEADER:
    FOR(i, size) {
      if (data[i] == H_1) {
        if (i + 1 < size) {
          if (data[i + 1] == H_2) {
            startPos = i;
            goto START_BUFFER;
          } else {
            continue;
          }
        } else {
          buffer_.push_back(data[i]);
          return;
        }
      }
    }
  } else if (buffer_.size() == 1) {
    assert(buffer_[0] == H_1);
    if (data[0] == H_2)
      goto START_BUFFER;
    else {
      buffer_.clear();
      buffer_.shrink_to_fit();
      goto START_HEADER;
    }
  } else {
  START_BUFFER:
    const auto needSize = buffer_.size() + size - startPos;
    if (needSize > maxBufferSize_) {
      PacketProcessor_LOGW("size too big, need: %zu, max: %zu", needSize, (size_t)maxBufferSize_);
      clearBuffer();
      return;
    }
    buffer_.insert(buffer_.end(), data + startPos, data + size - startPos);
  }

  // 尝试解包
  tryUnpack();
}